

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::convert_buffer
               (char_t **out_buffer,size_t *out_length,xml_encoding encoding,void *contents,
               size_t size,bool is_mutable)

{
  bool bVar1;
  xml_encoding xVar2;
  bool local_4c;
  bool local_4b;
  xml_encoding native_encoding_1;
  xml_encoding native_encoding;
  bool is_mutable_local;
  size_t size_local;
  void *contents_local;
  xml_encoding encoding_local;
  size_t *out_length_local;
  char_t **out_buffer_local;
  
  if (encoding == encoding_utf8) {
    out_buffer_local._7_1_ = get_mutable_buffer(out_buffer,out_length,contents,size,is_mutable);
  }
  else if ((encoding == encoding_utf16_be) || (encoding == encoding_utf16_le)) {
    bVar1 = is_little_endian();
    xVar2 = encoding_utf16_be;
    if (bVar1) {
      xVar2 = encoding_utf16_le;
    }
    if (xVar2 == encoding) {
      local_4b = (anonymous_namespace)::
                 convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_false>>
                           (out_buffer,out_length,contents,size);
    }
    else {
      local_4b = (anonymous_namespace)::
                 convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_true>>
                           (out_buffer,out_length,contents,size);
    }
    out_buffer_local._7_1_ = local_4b;
  }
  else if ((encoding == encoding_utf32_be) || (encoding == encoding_utf32_le)) {
    bVar1 = is_little_endian();
    xVar2 = encoding_utf32_be;
    if (bVar1) {
      xVar2 = encoding_utf32_le;
    }
    if (xVar2 == encoding) {
      local_4c = (anonymous_namespace)::
                 convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>>
                           (out_buffer,out_length,contents,size);
    }
    else {
      local_4c = (anonymous_namespace)::
                 convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_true>>
                           (out_buffer,out_length,contents,size);
    }
    out_buffer_local._7_1_ = local_4c;
  }
  else {
    if (encoding != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x8e3,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    out_buffer_local._7_1_ = convert_buffer_latin1(out_buffer,out_length,contents,size,is_mutable);
  }
  return out_buffer_local._7_1_;
}

Assistant:

PUGI__FN bool convert_buffer(char_t*& out_buffer, size_t& out_length, xml_encoding encoding, const void* contents, size_t size, bool is_mutable)
	{
		// fast path: no conversion required
		if (encoding == encoding_utf8)
			return get_mutable_buffer(out_buffer, out_length, contents, size, is_mutable);

		// source encoding is utf16
		if (encoding == encoding_utf16_be || encoding == encoding_utf16_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

			return (native_encoding == encoding) ?
				convert_buffer_generic(out_buffer, out_length, contents, size, utf16_decoder<opt_false>()) :
				convert_buffer_generic(out_buffer, out_length, contents, size, utf16_decoder<opt_true>());
		}

		// source encoding is utf32
		if (encoding == encoding_utf32_be || encoding == encoding_utf32_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

			return (native_encoding == encoding) ?
				convert_buffer_generic(out_buffer, out_length, contents, size, utf32_decoder<opt_false>()) :
				convert_buffer_generic(out_buffer, out_length, contents, size, utf32_decoder<opt_true>());
		}

		// source encoding is latin1
		if (encoding == encoding_latin1)
			return convert_buffer_latin1(out_buffer, out_length, contents, size, is_mutable);

		assert(false && "Invalid encoding"); // unreachable
		return false;
	}